

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2int8.cpp
# Opt level: O3

int __thiscall NetQuantize::quantize_innerproduct(NetQuantize *this)

{
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar1;
  Layer *pLVar2;
  int *piVar3;
  void *pvVar4;
  long *plVar5;
  ulong uVar6;
  bool bVar7;
  int iVar8;
  iterator iVar9;
  size_t sVar10;
  iterator iVar11;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_01;
  ulong uVar12;
  uint uVar13;
  Option opt_q;
  char key [256];
  key_type local_318;
  long *local_2f8;
  _Base_ptr local_2f0;
  _Base_ptr p_Stack_2e8;
  undefined4 local_2e0;
  pointer local_2d8;
  Mat local_2c8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  *local_280;
  Option *local_278;
  _Base_ptr local_270;
  _Base_ptr local_268;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  *local_260;
  Mat local_258;
  Mat local_210;
  Option local_1c8;
  Mat local_180;
  char local_138 [264];
  
  pvVar1 = (this->super_ModelWriter).layers;
  uVar13 = (uint)((ulong)((long)(pvVar1->
                                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar1->
                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar13) {
    local_260 = &this->blob_int8scale_table;
    local_268 = &(this->blob_int8scale_table)._M_t._M_impl.super__Rb_tree_header._M_header;
    this_00 = &this->weight_int8scale_table;
    local_270 = &(this->weight_int8scale_table)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_278 = &(this->super_ModelWriter).super_Net.opt;
    uVar12 = 0;
    do {
      iVar8 = std::__cxx11::string::compare
                        ((char *)&(((this->super_ModelWriter).layers)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[uVar12]->type);
      if ((iVar8 == 0) &&
         (iVar9 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
                  ::find(&local_260->_M_t,
                         &(((this->super_ModelWriter).layers)->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar12]->name),
         iVar9._M_node != local_268)) {
        sprintf(local_138,"%s_param_0",
                ((((this->super_ModelWriter).layers)->
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar12]->name)._M_dataplus._M_p);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        sVar10 = strlen(local_138);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_318,local_138,local_138 + sVar10);
        local_280 = this_00;
        iVar11 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
                 ::find(&this_00->_M_t,&local_318);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p);
        }
        if (iVar11._M_node == local_270) {
          quantize_innerproduct();
          return -1;
        }
        pLVar2 = (((this->super_ModelWriter).layers)->
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar12];
        local_318._M_dataplus._M_p = *(pointer *)(iVar9._M_node + 2);
        local_318._M_string_length = (size_type)iVar9._M_node[2]._M_parent;
        local_318.field_2._M_allocated_capacity = (size_type)iVar9._M_node[2]._M_left;
        local_318.field_2._8_4_ = *(undefined4 *)&iVar9._M_node[2]._M_right;
        local_2f8 = *(long **)(iVar9._M_node + 3);
        local_2f0 = iVar9._M_node[3]._M_parent;
        p_Stack_2e8 = iVar9._M_node[3]._M_left;
        local_2e0 = *(undefined4 *)&iVar9._M_node[3]._M_right;
        local_2d8 = *(pointer *)(iVar9._M_node + 4);
        if ((_Base_ptr)local_318._M_string_length != (_Base_ptr)0x0) {
          LOCK();
          ((_Base_ptr)local_318._M_string_length)->_M_color =
               ((_Base_ptr)local_318._M_string_length)->_M_color + _S_black;
          UNLOCK();
        }
        local_2c8.data = *(void **)(iVar11._M_node + 2);
        local_2c8.refcount = (int *)iVar11._M_node[2]._M_parent;
        local_2c8.elemsize = (size_t)iVar11._M_node[2]._M_left;
        local_2c8.elempack = *(int *)&iVar11._M_node[2]._M_right;
        local_2c8.allocator = *(Allocator **)(iVar11._M_node + 3);
        local_2c8.dims = *(int *)&iVar11._M_node[3]._M_parent;
        local_2c8.w = *(int *)((long)&iVar11._M_node[3]._M_parent + 4);
        local_2c8.h = *(int *)&iVar11._M_node[3]._M_left;
        local_2c8.d = *(int *)((long)&iVar11._M_node[3]._M_left + 4);
        local_2c8.c = *(int *)&iVar11._M_node[3]._M_right;
        local_2c8.cstep = *(size_t *)(iVar11._M_node + 4);
        if ((_Base_ptr)local_2c8.refcount != (_Base_ptr)0x0) {
          LOCK();
          ((_Base_ptr)local_2c8.refcount)->_M_color =
               ((_Base_ptr)local_2c8.refcount)->_M_color + _S_black;
          UNLOCK();
        }
        fprintf(_stderr,"quantize_innerproduct %s\n",(pLVar2->name)._M_dataplus._M_p);
        this_01 = &pLVar2[1].name.field_2;
        ncnn::Mat::reshape(&local_180,(Mat *)this_01,
                           *(int *)&pLVar2[1].one_blob_only / *(int *)&pLVar2[1]._vptr_Layer,
                           *(int *)&pLVar2[1]._vptr_Layer,(Allocator *)0x0);
        local_258.cstep = 0;
        local_258.data = (void *)0x0;
        local_258.refcount._0_4_ = 0;
        local_258.refcount._4_4_ = 0;
        local_258.elemsize._0_4_ = 0;
        local_258._20_8_ = 0;
        local_258.h = 0;
        local_258.d = 0;
        local_258.c = 0;
        local_258.allocator = (Allocator *)0x0;
        local_258.dims = 0;
        local_258.w = 0;
        local_1c8.lightmode = local_278->lightmode;
        local_1c8._1_3_ = *(undefined3 *)&local_278->field_0x1;
        local_1c8.num_threads = local_278->num_threads;
        local_1c8.blob_allocator = local_278->blob_allocator;
        local_1c8.workspace_allocator = local_278->workspace_allocator;
        local_1c8.openmp_blocktime = local_278->openmp_blocktime;
        local_1c8.use_winograd_convolution = local_278->use_winograd_convolution;
        local_1c8.use_sgemm_convolution = local_278->use_sgemm_convolution;
        local_1c8.use_int8_inference = local_278->use_int8_inference;
        local_1c8.use_vulkan_compute = local_278->use_vulkan_compute;
        uVar6._0_1_ = local_278->use_bf16_storage;
        uVar6._1_1_ = local_278->use_fp16_packed;
        uVar6._2_1_ = local_278->use_fp16_storage;
        uVar6._3_1_ = local_278->use_fp16_arithmetic;
        uVar6._4_1_ = local_278->use_int8_packed;
        uVar6._5_1_ = local_278->use_int8_storage;
        uVar6._6_1_ = local_278->use_int8_arithmetic;
        uVar6._7_1_ = local_278->use_packing_layout;
        local_1c8.use_shader_pack8 = local_278->use_shader_pack8;
        local_1c8.use_subgroup_basic = local_278->use_subgroup_basic;
        local_1c8.use_subgroup_vote = local_278->use_subgroup_vote;
        local_1c8.use_subgroup_ballot = local_278->use_subgroup_ballot;
        local_1c8.use_subgroup_shuffle = local_278->use_subgroup_shuffle;
        local_1c8.use_image_storage = local_278->use_image_storage;
        local_1c8.use_tensor_storage = local_278->use_tensor_storage;
        local_1c8.use_weight_fp16_storage = local_278->use_weight_fp16_storage;
        local_1c8.flush_denormals = local_278->flush_denormals;
        local_1c8.use_local_pool_allocator = local_278->use_local_pool_allocator;
        local_1c8.use_reserved_1 = local_278->use_reserved_1;
        local_1c8.use_reserved_2 = local_278->use_reserved_2;
        local_1c8.use_reserved_3 = local_278->use_reserved_3;
        local_1c8.use_reserved_4 = local_278->use_reserved_4;
        local_1c8.use_reserved_5 = local_278->use_reserved_5;
        local_1c8.use_reserved_6 = local_278->use_reserved_6;
        local_1c8.use_reserved_7 = local_278->use_reserved_7;
        local_1c8.use_reserved_8 = local_278->use_reserved_8;
        local_1c8.use_reserved_9 = local_278->use_reserved_9;
        local_1c8.use_reserved_10 = local_278->use_reserved_10;
        local_1c8.use_reserved_11 = local_278->use_reserved_11;
        local_1c8._32_8_ = uVar6 & 0xffffffffffffff;
        ncnn::quantize_to_int8(&local_180,&local_258,&local_2c8,&local_1c8);
        bVar7 = true;
        if ((local_258.data != (void *)0x0) && ((long)local_258.c * local_258.cstep != 0)) {
          iVar8._0_1_ = pLVar2[1].one_blob_only;
          iVar8._1_1_ = pLVar2[1].support_inplace;
          iVar8._2_1_ = pLVar2[1].support_vulkan;
          iVar8._3_1_ = pLVar2[1].support_packing;
          ncnn::Mat::reshape(&local_210,&local_258,iVar8,(Allocator *)0x0);
          if ((Mat *)this_01 != &local_210) {
            if (local_210.refcount != (int *)0x0) {
              LOCK();
              *local_210.refcount = *local_210.refcount + 1;
              UNLOCK();
            }
            piVar3 = *(int **)((long)&pLVar2[1].name.field_2 + 8);
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                pvVar4 = (void *)pLVar2[1].name.field_2._M_allocated_capacity;
                plVar5 = (long *)pLVar2[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage;
                if (plVar5 == (long *)0x0) {
                  if (pvVar4 != (void *)0x0) {
                    free(pvVar4);
                  }
                }
                else {
                  (**(code **)(*plVar5 + 0x18))();
                }
              }
            }
            pLVar2[1].name.field_2._M_allocated_capacity = (size_type)local_210.data;
            *(int **)((long)&pLVar2[1].name.field_2 + 8) = local_210.refcount;
            *(size_t *)
             &pLVar2[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data = local_210.elemsize;
            *(int *)&pLVar2[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish = local_210.elempack;
            pLVar2[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)local_210.allocator;
            *(int *)&pLVar2[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data = local_210.dims;
            *(int *)((long)&pLVar2[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 4) = local_210.w;
            *(int *)&pLVar2[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish = local_210.h;
            *(int *)((long)&pLVar2[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish + 4) = local_210.d;
            *(int *)&pLVar2[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage = local_210.c;
            *(size_t *)
             &pLVar2[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data = local_210.cstep;
          }
          if (local_210.refcount != (int *)0x0) {
            LOCK();
            *local_210.refcount = *local_210.refcount + -1;
            UNLOCK();
            if (*local_210.refcount == 0) {
              if (local_210.allocator == (Allocator *)0x0) {
                if (local_210.data != (void *)0x0) {
                  free(local_210.data);
                }
              }
              else {
                (*(local_210.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          bVar7 = false;
        }
        piVar3 = (int *)CONCAT44(local_258.refcount._4_4_,local_258.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_258.allocator == (Allocator *)0x0) {
              if (local_258.data != (void *)0x0) {
                free(local_258.data);
              }
            }
            else {
              (*(local_258.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if (local_180.refcount != (int *)0x0) {
          LOCK();
          *local_180.refcount = *local_180.refcount + -1;
          UNLOCK();
          if (*local_180.refcount == 0) {
            if (local_180.allocator == (Allocator *)0x0) {
              if (local_180.data != (void *)0x0) {
                free(local_180.data);
              }
            }
            else {
              (*(local_180.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if (!bVar7) {
          pLVar2[1].support_bf16_storage = true;
          pLVar2[1].support_fp16_storage = false;
          pLVar2[1].support_int8_storage = false;
          pLVar2[1].support_image_storage = false;
          if ((Mat *)&pLVar2[2].userdata != &local_2c8) {
            if ((_Base_ptr)local_2c8.refcount != (_Base_ptr)0x0) {
              LOCK();
              *(_Rb_tree_color *)local_2c8.refcount =
                   *(_Rb_tree_color *)local_2c8.refcount + _S_black;
              UNLOCK();
            }
            piVar3 = *(int **)&pLVar2[2].typeindex;
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                plVar5 = (long *)pLVar2[2].type.field_2._M_allocated_capacity;
                if (plVar5 == (long *)0x0) {
                  if (pLVar2[2].userdata != (void *)0x0) {
                    free(pLVar2[2].userdata);
                  }
                }
                else {
                  (**(code **)(*plVar5 + 0x18))();
                }
              }
            }
            pLVar2[2].userdata = local_2c8.data;
            *(int **)&pLVar2[2].typeindex = local_2c8.refcount;
            pLVar2[2].type._M_dataplus._M_p = (pointer)local_2c8.elemsize;
            *(int *)&pLVar2[2].type._M_string_length = local_2c8.elempack;
            pLVar2[2].type.field_2._M_allocated_capacity = (size_type)local_2c8.allocator;
            *(int *)((long)&pLVar2[2].type.field_2 + 8) = local_2c8.dims;
            *(int *)((long)&pLVar2[2].type.field_2 + 0xc) = local_2c8.w;
            *(int *)&pLVar2[2].name._M_dataplus._M_p = local_2c8.h;
            *(int *)((long)&pLVar2[2].name._M_dataplus._M_p + 4) = local_2c8.d;
            *(int *)&pLVar2[2].name._M_string_length = local_2c8.c;
            pLVar2[2].name.field_2._M_allocated_capacity = local_2c8.cstep;
          }
          if ((key_type *)((long)&pLVar2[2].name.field_2 + 8) != &local_318) {
            if ((_Base_ptr)local_318._M_string_length != (_Base_ptr)0x0) {
              LOCK();
              *(_Rb_tree_color *)local_318._M_string_length =
                   *(_Rb_tree_color *)local_318._M_string_length + _S_black;
              UNLOCK();
            }
            piVar3 = pLVar2[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                pvVar4 = *(void **)((long)&pLVar2[2].name.field_2 + 8);
                plVar5 = *(long **)&pLVar2[2].tops.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data;
                if (plVar5 == (long *)0x0) {
                  if (pvVar4 != (void *)0x0) {
                    free(pvVar4);
                  }
                }
                else {
                  (**(code **)(*plVar5 + 0x18))();
                }
              }
            }
            *(pointer *)((long)&pLVar2[2].name.field_2 + 8) = local_318._M_dataplus._M_p;
            *(size_type *)
             &pLVar2[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data = local_318._M_string_length;
            pLVar2[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)local_318.field_2._M_allocated_capacity;
            *(undefined4 *)
             &pLVar2[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = local_318.field_2._8_4_;
            *(long **)&pLVar2[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data = local_2f8;
            pLVar2[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)local_2f0;
            pLVar2[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)p_Stack_2e8;
            *(undefined4 *)
             &pLVar2[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data = local_2e0;
            pLVar2[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
            _M_impl.super__Vector_impl_data._M_finish = local_2d8;
          }
        }
        if ((_Base_ptr)local_2c8.refcount != (_Base_ptr)0x0) {
          LOCK();
          *(_Rb_tree_color *)local_2c8.refcount = *(_Rb_tree_color *)local_2c8.refcount - _S_black;
          UNLOCK();
          if (*(_Rb_tree_color *)local_2c8.refcount == _S_red) {
            if (local_2c8.allocator == (Allocator *)0x0) {
              if (local_2c8.data != (void *)0x0) {
                free(local_2c8.data);
              }
            }
            else {
              (*(local_2c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if ((_Base_ptr)local_318._M_string_length != (_Base_ptr)0x0) {
          LOCK();
          *(_Rb_tree_color *)local_318._M_string_length =
               *(_Rb_tree_color *)local_318._M_string_length - _S_black;
          UNLOCK();
          if (*(_Rb_tree_color *)local_318._M_string_length == _S_red) {
            if (local_2f8 == (long *)0x0) {
              if (local_318._M_dataplus._M_p != (pointer)0x0) {
                free(local_318._M_dataplus._M_p);
              }
            }
            else {
              (**(code **)(*local_2f8 + 0x18))();
            }
          }
        }
        this_00 = local_280;
        if (bVar7) {
          return -100;
        }
      }
      uVar12 = uVar12 + 1;
    } while ((uVar13 & 0x7fffffff) != uVar12);
  }
  return 0;
}

Assistant:

int NetQuantize::quantize_innerproduct()
{
    const int layer_count = static_cast<int>(layers.size());
    for (int i = 0; i < layer_count; i++)
    {
        // find convolution layer
        if (layers[i]->type != "InnerProduct")
            continue;

        // find InnerProduct layer
        std::map<std::string, ncnn::Mat>::iterator iter_data = blob_int8scale_table.find(layers[i]->name);
        if (iter_data == blob_int8scale_table.end())
            continue;

        char key[256];
        sprintf(key, "%s_param_0", layers[i]->name.c_str());

        std::map<std::string, ncnn::Mat>::iterator iter = weight_int8scale_table.find(key);
        if (iter == weight_int8scale_table.end())
        {
            fprintf(stderr, "this layer need to be quantized, but no scale param!\n");
            return -1;
        }

        // InnerProduct - quantize weight from fp32 to int8
        ncnn::InnerProduct* fc = (ncnn::InnerProduct*)layers[i];

        ncnn::Mat bottom_blob_int8_scales = iter_data->second;
        ncnn::Mat weight_data_int8_scales = iter->second;

        fprintf(stderr, "quantize_innerproduct %s\n", fc->name.c_str());

        {
            const int num_input = fc->weight_data_size / fc->num_output;

            ncnn::Mat weight_data_r2 = fc->weight_data.reshape(num_input, fc->num_output);

            ncnn::Mat weight_data_int8;
            ncnn::Option opt_q = opt;
            opt_q.use_packing_layout = false;
            ncnn::quantize_to_int8(weight_data_r2, weight_data_int8, weight_data_int8_scales, opt_q);
            if (weight_data_int8.empty())
                return -100;

            fc->weight_data = weight_data_int8.reshape(fc->weight_data_size);
        }

        fc->int8_scale_term = 2;
        fc->weight_data_int8_scales = weight_data_int8_scales;
        fc->bottom_blob_int8_scales = bottom_blob_int8_scales;
    }

    return 0;
}